

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Impl::~Impl(Impl *this)

{
  HashBucket *pHVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *pRVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  RemoveConst<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> *pRVar8
  ;
  Entry *pEVar9;
  Entry *pEVar10;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  *pRVar11;
  Entry *pEVar12;
  Entry *pEVar13;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *pRVar14;
  Entry *pEVar15;
  ArrayPtr<const_unsigned_char> *pAVar16;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar17;
  ArrayPtr<const_unsigned_char> *pAVar18;
  
  pHVar1 = (this->structSizeRequirements).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->structSizeRequirements).table.indexes.buckets.size_;
    (this->structSizeRequirements).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->structSizeRequirements).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->structSizeRequirements).table.indexes.buckets.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar4 = (this->structSizeRequirements).table.rows.builder.ptr;
  if (pEVar4 != (Entry *)0x0) {
    pRVar5 = (this->structSizeRequirements).table.rows.builder.pos;
    pEVar6 = (this->structSizeRequirements).table.rows.builder.endPtr;
    (this->structSizeRequirements).table.rows.builder.ptr = (Entry *)0x0;
    (this->structSizeRequirements).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *)
         0x0;
    (this->structSizeRequirements).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->structSizeRequirements).table.rows.builder.disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pEVar4,0x10,(long)pRVar5 - (long)pEVar4 >> 4,(long)pEVar6 - (long)pEVar4 >> 4,
               0);
  }
  pHVar1 = (this->unboundBrands).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->unboundBrands).table.indexes.buckets.size_;
    (this->unboundBrands).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->unboundBrands).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->unboundBrands).table.indexes.buckets.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar7 = (this->unboundBrands).table.rows.builder.ptr;
  if (pEVar7 != (Entry *)0x0) {
    pRVar8 = (this->unboundBrands).table.rows.builder.pos;
    pEVar9 = (this->unboundBrands).table.rows.builder.endPtr;
    (this->unboundBrands).table.rows.builder.ptr = (Entry *)0x0;
    (this->unboundBrands).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>
          *)0x0;
    (this->unboundBrands).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->unboundBrands).table.rows.builder.disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pEVar7,0x10,(long)pRVar8 - (long)pEVar7 >> 4,(long)pEVar9 - (long)pEVar7 >> 4,
               0);
  }
  pHVar1 = (this->brands).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->brands).table.indexes.buckets.size_;
    (this->brands).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->brands).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->brands).table.indexes.buckets.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar10 = (this->brands).table.rows.builder.ptr;
  if (pEVar10 != (Entry *)0x0) {
    pRVar11 = (this->brands).table.rows.builder.pos;
    pEVar12 = (this->brands).table.rows.builder.endPtr;
    (this->brands).table.rows.builder.ptr = (Entry *)0x0;
    (this->brands).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
          *)0x0;
    (this->brands).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->brands).table.rows.builder.disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pEVar10,0x18,((long)pRVar11 - (long)pEVar10 >> 3) * -0x5555555555555555,
               ((long)pEVar12 - (long)pEVar10 >> 3) * -0x5555555555555555,0);
  }
  pHVar1 = (this->schemas).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->schemas).table.indexes.buckets.size_;
    (this->schemas).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->schemas).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->schemas).table.indexes.buckets.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar13 = (this->schemas).table.rows.builder.ptr;
  if (pEVar13 != (Entry *)0x0) {
    pRVar14 = (this->schemas).table.rows.builder.pos;
    pEVar15 = (this->schemas).table.rows.builder.endPtr;
    (this->schemas).table.rows.builder.ptr = (Entry *)0x0;
    (this->schemas).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)0x0;
    (this->schemas).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->schemas).table.rows.builder.disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pEVar13,0x10,(long)pRVar14 - (long)pEVar13 >> 4,
               (long)pEVar15 - (long)pEVar13 >> 4,0);
  }
  pHVar1 = (this->dedupTable).
           super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
           indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->dedupTable).
            super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
            indexes.buckets.size_;
    (this->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
    buckets.ptr = (HashBucket *)0x0;
    (this->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
    buckets.size_ = 0;
    pAVar3 = (this->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .indexes.buckets.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pAVar16 = (this->dedupTable).
            super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
            rows.builder.ptr;
  if (pAVar16 != (ArrayPtr<const_unsigned_char> *)0x0) {
    pRVar17 = (this->dedupTable).
              super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
              .rows.builder.pos;
    pAVar18 = (this->dedupTable).
              super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
              .rows.builder.endPtr;
    (this->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
    builder.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    (this->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
    builder.pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
    (this->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
    builder.endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
    pAVar3 = (this->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .rows.builder.disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pAVar16,0x10,(long)pRVar17 - (long)pAVar16 >> 4,
               (long)pAVar18 - (long)pAVar16 >> 4,0);
  }
  kj::Arena::~Arena(&this->arena);
  return;
}

Assistant:

inline explicit Impl(const SchemaLoader& loader)
      : initializer(loader), brandedInitializer(loader) {}